

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm,
                       ZSTD_tableFillPurpose_e tfp)

{
  int in_ECX;
  ZSTD_dictTableLoadMethod_e in_stack_00000044;
  void *in_stack_00000048;
  ZSTD_matchState_t *in_stack_00000050;
  
  if (in_ECX == 1) {
    ZSTD_fillHashTableForCDict(in_stack_00000050,in_stack_00000048,in_stack_00000044);
  }
  else {
    ZSTD_fillHashTableForCCtx(in_stack_00000050,in_stack_00000048,in_stack_00000044);
  }
  return;
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm,
                        ZSTD_tableFillPurpose_e tfp)
{
    if (tfp == ZSTD_tfp_forCDict) {
        ZSTD_fillHashTableForCDict(ms, end, dtlm);
    } else {
        ZSTD_fillHashTableForCCtx(ms, end, dtlm);
    }
}